

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O2

bool __thiscall ON_BinaryArchive::WriteObjectUserData(ON_BinaryArchive *this,ON_Object *object)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  ON_UserData *this_00;
  ON_ClassId *this_01;
  char *pcVar7;
  ON_UnknownUserData *pOVar8;
  long lVar9;
  ON_3DM_BIG_CHUNK *pOVar10;
  ON_UserData *p;
  ulong uVar11;
  int *piVar12;
  ON_UUID local_88;
  uint local_74;
  ON_UUID *local_70;
  int *local_68;
  ON_UUID *local_60;
  ON_UUID local_58;
  undefined4 local_44;
  ON_UUID *local_40;
  ON_SimpleArray<ON_UUID_struct> *local_38;
  undefined4 extraout_var_01;
  
  bVar2 = true;
  if (2 < this->m_3dm_version) {
    bVar1 = ShouldSerializeAllUserData(this);
    if (bVar1) {
      uVar11 = 0;
      local_74 = 0;
    }
    else {
      bVar2 = ShouldSerializeSomeUserData(this);
      uVar11 = CONCAT71(extraout_var,bVar2) & 0xffffffff;
      bVar2 = ObjectHasUserDataToWrite(this,object);
      local_74 = (uint)CONCAT71(extraout_var_00,bVar2) ^ 1;
    }
    local_68 = &this->m_3dm_version;
    this_00 = ON_Object::FirstUserData(object);
    local_38 = &this->m_V3_plugin_id_list;
    local_44 = (undefined4)CONCAT71((int7)(uVar11 >> 8),(byte)uVar11 | bVar1);
    local_40 = (ON_UUID *)&this->m_3dm_opennurbs_version;
    bVar2 = true;
    p = (ON_UserData *)0x0;
    while ((this_00 != (ON_UserData *)0x0 && (bVar2 != false))) {
      if ((p != (ON_UserData *)0x0) &&
         ((p->m_userdata_next == this_00 && (bVar2 = ON_Object::DetachUserData(object,p), bVar2))))
      {
        (*(p->super_ON_Object)._vptr_ON_Object[4])(p);
      }
      iVar5 = (*(this_00->super_ON_Object)._vptr_ON_Object[0x1b])(this_00,this,object);
      p = (ON_UserData *)0x0;
      if ((char)iVar5 != '\0') {
        p = this_00;
      }
      bVar2 = true;
      if (((char)local_74 == '\0') &&
         (iVar5 = (*(this_00->super_ON_Object)._vptr_ON_Object[0x1a])(this_00,this,object),
         (char)iVar5 != '\0')) {
        local_60 = &this_00->m_userdata_uuid;
        iVar5 = ON_UuidCompare(local_60,&ON_nil_uuid);
        if ((iVar5 != 0) && (this_00->m_userdata_owner == object)) {
          iVar5 = (**(this_00->super_ON_Object)._vptr_ON_Object)(this_00);
          this_01 = (ON_ClassId *)CONCAT44(extraout_var_01,iVar5);
          if (((this_01 != &ON_Object::m_ON_Object_class_rtti) && (this_01 != (ON_ClassId *)0x0)) &&
             (this_01 != &ON_UserData::m_ON_UserData_class_rtti)) {
            local_58 = ON_UserData::UserDataClassUuid(this_00);
            iVar5 = ON_UuidCompare(&local_58,&ON_nil_uuid);
            if (iVar5 != 0) {
              local_88 = ON_ClassId::Uuid(&ON_UserData::m_ON_UserData_class_rtti);
              iVar5 = ON_UuidCompare(&local_58,&local_88);
              if (iVar5 != 0) {
                local_88 = ON_ClassId::Uuid(&ON_Object::m_ON_Object_class_rtti);
                iVar5 = ON_UuidCompare(&local_58,&local_88);
                if (iVar5 != 0) {
                  local_88 = ON_ClassId::Uuid(&ON_UnknownUserData::m_ON_UnknownUserData_class_rtti);
                  iVar5 = ON_UuidCompare(&local_58,&local_88);
                  if (iVar5 != 0) {
                    local_88 = ON_ClassId::Uuid(&ON_ObsoleteUserData::
                                                 m_ON_ObsoleteUserData_class_rtti);
                    iVar5 = ON_UuidCompare(&local_58,&local_88);
                    if (((iVar5 != 0) &&
                        ((*local_68 != 3 ||
                         (iVar5 = ON_SimpleArray<ON_UUID_struct>::BinarySearch
                                            (local_38,&this_00->m_application_uuid,ON_UuidCompare),
                         -1 < iVar5)))) &&
                       ((bVar1 || (bVar3 = ShouldSerializeUserDataItem
                                                     (this,this_00->m_application_uuid,
                                                      this_00->m_userdata_uuid), bVar3)))) {
                      local_70 = &this_00->m_application_uuid;
                      bVar3 = ON_UuidIsNil(local_70);
                      if (bVar3) {
                        pcVar7 = ON_ClassId::ClassName(this_01);
                        ON_Error("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                                 ,0x130f,"Not saving %s userdata - m_application_uuid is nil.",
                                 pcVar7);
                      }
                      else {
                        pOVar8 = ON_UnknownUserData::Cast(&this_00->super_ON_Object);
                        bVar3 = ON_UserData::IsUnknownUserData(this_00);
                        if (pOVar8 == (ON_UnknownUserData *)0x0) {
                          if (bVar3) {
                            iVar5 = 0x131a;
                            pcVar7 = 
                            "ON_UnknownUserData::Cast(ud) is null and ud->IsUnknownUserData() is true."
                            ;
                            goto LAB_003c9cfc;
                          }
LAB_003c9d08:
                          bVar2 = false;
                          bVar3 = BeginWrite3dmBigChunk(this,0x27ffd,0);
                          if (!bVar3) goto LAB_003c9ac0;
                          WriteChar(this,'\"');
                          bVar2 = BeginWrite3dmBigChunk(this,0x2fff9,0);
                          bVar4 = 0;
                          if (bVar2) {
                            bVar2 = WriteUuid(this,&local_58);
                            if ((((bVar2) && (bVar2 = WriteUuid(this,local_60), bVar2)) &&
                                (bVar2 = WriteInt(this,this_00->m_userdata_copycount), bVar2)) &&
                               ((bVar2 = WriteXform(this,&this_00->m_userdata_xform), bVar2 &&
                                (bVar2 = WriteUuid(this,local_70), bVar2)))) {
                              local_60 = (ON_UUID *)&pOVar8->m_3dm_opennurbs_version_number;
                              if (pOVar8 == (ON_UnknownUserData *)0x0) {
                                local_60 = local_40;
                              }
                              piVar12 = &pOVar8->m_3dm_version;
                              if (pOVar8 == (ON_UnknownUserData *)0x0) {
                                piVar12 = local_68;
                              }
                              WriteBool(this,pOVar8 != (ON_UnknownUserData *)0x0);
                              uVar6 = *piVar12;
                              bVar2 = WriteInt(this,uVar6);
                              local_70 = (ON_UUID *)CONCAT71(local_70._1_7_,bVar2);
                              uVar6 = ArchiveOpenNURBSVersionToWrite(uVar6,local_60->Data1);
                              if ((char)local_70 == '\0') goto LAB_003c9e19;
                              bVar2 = WriteInt(this,uVar6);
                            }
                            else {
LAB_003c9e19:
                              bVar2 = false;
                            }
                            bVar3 = EndWrite3dmChunk(this);
                            bVar4 = 0;
                            if (((bVar3 & bVar2) == 1) &&
                               (bVar2 = BeginWrite3dmBigChunk(this,0x40008000,0), bVar4 = 0, bVar2))
                            {
                              if (pOVar8 != (ON_UnknownUserData *)0x0) {
                                lVar9 = (long)(this->m_chunk).m_count;
                                pOVar10 = (this->m_chunk).m_a + lVar9 + -1;
                                if (lVar9 < 1) {
                                  pOVar10 = (ON_3DM_BIG_CHUNK *)0x0;
                                }
                                pOVar10->m_do_crc16 = '\0';
                                pOVar10 = (this->m_chunk).m_a + lVar9 + -1;
                                if (lVar9 < 1) {
                                  pOVar10 = (ON_3DM_BIG_CHUNK *)0x0;
                                }
                                pOVar10->m_do_crc32 = '\0';
                                this->m_bDoChunkCRC = false;
                              }
                              iVar5 = this->m_user_data_depth;
                              if (iVar5 < 0) {
                                iVar5 = 0;
                                ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                                           ,0x137d,"","m_user_data_depth < 0");
                              }
                              this->m_user_data_depth = iVar5 + 1;
                              iVar5 = (*(this_00->super_ON_Object)._vptr_ON_Object[10])
                                                (this_00,this);
                              this->m_user_data_depth = this->m_user_data_depth + -1;
                              bVar2 = EndWrite3dmChunk(this);
                              bVar4 = bVar2 & (byte)iVar5;
                            }
                          }
                          bVar2 = EndWrite3dmChunk(this);
                          bVar2 = (bool)(bVar2 & bVar4);
                        }
                        else if (bVar3) {
                          if ((((char)local_44 != '\0') &&
                              (uVar6 = pOVar8->m_3dm_version, 0x2b < uVar6 - 6 && 3 < (int)uVar6))
                             && ((0xbf67451 < pOVar8->m_3dm_opennurbs_version_number &&
                                 ((uVar6 < 0x32 || (0x31 < *local_68)))))) goto LAB_003c9d08;
                        }
                        else {
                          iVar5 = 0x1322;
                          pcVar7 = 
                          "ON_UnknownUserData::Cast(ud) is not null and ud->IsUnknownUserData() is false."
                          ;
LAB_003c9cfc:
                          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                                     ,iVar5,"",pcVar7);
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
LAB_003c9ac0:
      this_00 = this_00->m_userdata_next;
    }
    if (((p != (ON_UserData *)0x0) && (p->m_userdata_next == (ON_UserData *)0x0)) &&
       (bVar1 = ON_Object::DetachUserData(object,p), bVar1)) {
      (*(p->super_ON_Object)._vptr_ON_Object[4])(p);
    }
  }
  return bVar2;
}

Assistant:

bool ON_BinaryArchive::WriteObjectUserData( const ON_Object& object )
{
  if ( m_3dm_version < 3 )
  {
    // no user data is saved in V1 and V2 files.
    return true;
  }

  const bool bSaveAllUserData = ShouldSerializeAllUserData();
  const bool bSaveSelectedUserData = bSaveAllUserData ? false : ShouldSerializeSomeUserData();
  const bool bHasWritableUserData = (bSaveAllUserData || ObjectHasUserDataToWrite(&object));

  // writes user data attached to object.
  bool rc = true;
  const ON_UserData* ud;
  ON_UUID userdata_classid;

  ON_UserData* delete_this_ud = 0;
  
  for (ud = object.FirstUserData(); ud && rc; ud = ud->m_userdata_next) 
  {
    if (0 != delete_this_ud)
    {
      if (delete_this_ud->m_userdata_next == ud)
      {
        if (const_cast<ON_Object&>(object).DetachUserData(delete_this_ud))
          delete delete_this_ud;
      }
      delete_this_ud = 0;
    }

    if (ud->DeleteAfterWrite(*this,&object))
      delete_this_ud = const_cast< ON_UserData* >(ud);

    if (false == bHasWritableUserData)
      continue;

    if (!ud->WriteToArchive(*this,&object))
      continue;

    // LOTS of tests to weed out bogus user data
    if ( 0 == ON_UuidCompare( ud->m_userdata_uuid, ON_nil_uuid ) )
      continue;
    if ( &object != ud->m_userdata_owner )
      continue;
    const ON_ClassId* cid = ud->ClassId();
    if ( 0 == cid )
      continue;
    if ( cid == &ON_CLASS_RTTI(ON_UserData) )
      continue;
    if ( cid == &ON_CLASS_RTTI(ON_Object) )
      continue;

    // The UserDataClassUuid() function is used instead of 
    // calling cid->Uuid() so we get the value of the 
    // plug-in's class id when the plug-in is not loaded
    // and ud is ON_UnknownUserData.
    userdata_classid = ud->UserDataClassUuid();
    if ( 0 == ON_UuidCompare( userdata_classid, ON_nil_uuid ) )
      continue;
    if ( 0 == ON_UuidCompare( userdata_classid, ON_CLASS_ID(ON_UserData) ) )
      continue;
    if ( 0 == ON_UuidCompare( userdata_classid, ON_CLASS_ID(ON_Object) ) )
      continue;
    if (0 == ON_UuidCompare(userdata_classid, ON_CLASS_ID(ON_UnknownUserData)))
      continue;
    if (0 == ON_UuidCompare(userdata_classid, ON_CLASS_ID(ON_ObsoleteUserData)))
      continue;

    if ( 3 == m_3dm_version )
    {
      // When saving a V3 archive and the user data is not
      // native V3 data, make sure the plug-in supports
      // writing V3 user data.
      if ( m_V3_plugin_id_list.BinarySearch( &ud->m_application_uuid, ON_UuidCompare ) < 0 )
        continue;
    }

    if (false == bSaveAllUserData 
        && false == ShouldSerializeUserDataItem(ud->m_application_uuid, ud->m_userdata_uuid)
       )
      continue;

    if ( ON_UuidIsNil( ud->m_application_uuid ) )
    {
      // As of version 200909190 - a non-nil application_uuid is 
      // required in order for user data to be saved in a 
      // 3dm archive.
      ON_Error(__FILE__,__LINE__,"Not saving %s userdata - m_application_uuid is nil.",cid->ClassName());
      continue; 
    }

    // See if we have unknown user data (goo) and make sure
    // IsUnknownUserData() agrees with ON_UnknownUserData::Cast().
    const ON_UnknownUserData* unknown_ud = ON_UnknownUserData::Cast(ud);
    if ( 0 == unknown_ud )
    {
      if ( ud->IsUnknownUserData() )
      {
        ON_ERROR("ON_UnknownUserData::Cast(ud) is null and ud->IsUnknownUserData() is true.");
        continue; // something's wrong
      }
    }
    else
    {
      if ( !ud->IsUnknownUserData() )
      {
        ON_ERROR("ON_UnknownUserData::Cast(ud) is not null and ud->IsUnknownUserData() is false.");
        continue; // something's wrong
      }
    }

    if ( 0 != unknown_ud )
    {
      if (false == bSaveAllUserData && false == bSaveSelectedUserData)
        continue; // unknown user data cannot be critical

      if ( unknown_ud->m_3dm_version <= 3 )
        continue; // Unknown will not be resaved in V3 archives

      if ( unknown_ud->m_3dm_version > 5 && unknown_ud->m_3dm_version < 50 )
        continue;

      if ( unknown_ud->m_3dm_opennurbs_version_number < 200701010 )
        continue;

      if ( unknown_ud->m_3dm_version >= 50 && m_3dm_version < 50 )
      {
        // Unknown userdata with 8 byte chunk lengths cannot be
        // saved into a V4 file with 4 byte chunk lengths because
        // the resulting chunk will be unreadable in V4.
        // This is not an error condition.  It is a consequence
        // of V4 IO code not being robust enough to handle
        // 8 bytes chunk lengths.
        continue;
      }
    }

    // Each piece of user data is inside of 
    // a TCODE_OPENNURBS_CLASS_USERDATA chunk.
    rc = BeginWrite3dmChunk( TCODE_OPENNURBS_CLASS_USERDATA, 0 );
    if (rc) {
      rc = Write3dmChunkVersion(2,2);
      // wrap user data header info in an TCODE_OPENNURBS_CLASS_USERDATA_HEADER chunk
      rc = BeginWrite3dmChunk( TCODE_OPENNURBS_CLASS_USERDATA_HEADER, 0 );
      if (rc) 
      {
        if ( rc ) rc = WriteUuid( userdata_classid );
        if ( rc ) rc = WriteUuid( ud->m_userdata_uuid );
        if ( rc ) rc = WriteInt( ud->m_userdata_copycount );
        if ( rc ) rc = WriteXform( ud->m_userdata_xform );

        // added for version 2.1
        if ( rc ) rc = WriteUuid( ud->m_application_uuid );

        // added for version 2.2 - 14, October 2009
        if ( rc )
        {
          rc = WriteBool( unknown_ud ? true : false );
          // ver = 2,3,4,50,60,...
          const int file_format_ver = unknown_ud ? unknown_ud->m_3dm_version : m_3dm_version;
          rc = WriteInt(file_format_ver);
          // ver = opennurbs version number
          unsigned int app_ver = unknown_ud ? unknown_ud->m_3dm_opennurbs_version_number : m_3dm_opennurbs_version;
          unsigned int app_ver_to_write = ON_BinaryArchive::ArchiveOpenNURBSVersionToWrite(file_format_ver, app_ver);
          if (rc) rc = WriteInt(app_ver_to_write);
        }

        if ( !EndWrite3dmChunk() )
          rc = false;
      }
      if (rc) 
      {
        // wrap user data in an anonymous chunk
        rc = BeginWrite3dmChunk( TCODE_ANONYMOUS_CHUNK, 0 );
        if ( rc ) 
        {
          if ( 0 != unknown_ud )
          {
            // 22 January 2004 Dale Lear
            //   Disable crc checking when writing the
            //   unknow user data block.
            //   This has to be done so we don't get an extra
            //   32 bit CRC calculated on the block that
            //   ON_UnknownUserData::Write() writes.  The
            //   original 32 bit crc is at the end of this
            //   block and will be checked when the class
            //   that wrote this user data is present.
            //   The EndWrite3dmChunk() will reset the
            //   CRC checking flags to the appropriate
            //   values.
            m_chunk.Last()->m_do_crc16 = 0;
            m_chunk.Last()->m_do_crc32 = 0;
            m_bDoChunkCRC = false;
          }

          if (m_user_data_depth < 0)
          {
            ON_ERROR("m_user_data_depth < 0");
            m_user_data_depth = 0;
          }
          m_user_data_depth++;
          rc = ud->Write(*this)?true:false;
          m_user_data_depth--;
          if ( !EndWrite3dmChunk() )
            rc = false;
        }
      }
      if ( !EndWrite3dmChunk() )
        rc = false;
    }
  }


  if (0 != delete_this_ud)
  {
    if (0 == delete_this_ud->m_userdata_next)
    {
      if (const_cast<ON_Object&>(object).DetachUserData(delete_this_ud))
        delete delete_this_ud;
    }
    delete_this_ud = 0;
  }

  return rc;
}